

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct(CompilerGLSL *this,uint32_t lhs_id,uint32_t value)

{
  undefined8 type_00;
  SmallVector<unsigned_int,_8UL> local_78;
  undefined1 local_40 [8];
  string basename;
  SPIRType *type;
  uint32_t value_local;
  uint32_t lhs_id_local;
  CompilerGLSL *this_local;
  
  basename.field_2._8_8_ = Compiler::expression_type(&this->super_Compiler,lhs_id);
  to_flattened_access_chain_expression_abi_cxx11_((string *)local_40,this,lhs_id);
  type_00 = basename.field_2._8_8_;
  SmallVector<unsigned_int,_8UL>::SmallVector(&local_78);
  store_flattened_struct(this,(string *)local_40,value,(SPIRType *)type_00,&local_78);
  SmallVector<unsigned_int,_8UL>::~SmallVector(&local_78);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(uint32_t lhs_id, uint32_t value)
{
	auto &type = expression_type(lhs_id);
	auto basename = to_flattened_access_chain_expression(lhs_id);
	store_flattened_struct(basename, value, type, {});
}